

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

void pbrt::detail::
     stringPrintfRecursive<int_const&,float_const&,pbrt::LightSamplerHandle_const&,bool_const&>
               (string *s,char *fmt,int *v,float *args,LightSamplerHandle *args_1,bool *args_2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  char **v_00;
  int *v_01;
  char cVar5;
  char *fmt_local;
  string nextFmt;
  undefined8 local_200 [4];
  undefined8 local_1e0;
  enable_if_t<_std::is_class<typename_std::decay_t<const_char_*>_>::value,_std::string> local_1d8;
  stringstream ss;
  undefined1 local_1a8 [376];
  
  v_00 = (char **)args;
  fmt_local = fmt;
  copyToFormatString(&nextFmt,&fmt_local,s);
  cVar5 = (char)&nextFmt;
  lVar1 = std::__cxx11::string::find(cVar5,0x2a);
  lVar2 = std::__cxx11::string::find(cVar5,0x73);
  lVar3 = std::__cxx11::string::find(cVar5,100);
  if (lVar1 != -1) {
    stringPrintfRecursiveWithPrecision<float_const&,pbrt::LightSamplerHandle_const&,bool_const&>
              (s,fmt_local,&nextFmt,*v,args,args_1,args_2);
    goto LAB_00417c95;
  }
  if (lVar3 == -1) {
    if (lVar2 == -1) {
      if (nextFmt._M_string_length == 0) {
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
                 ,0x10d,"Excess values passed to Printf.");
      }
      formatOne<int_const&>
                ((enable_if_t<_std::is_class<typename_std::decay_t<const_int_&>_>::value,_std::string>
                  *)&ss,(detail *)nextFmt._M_dataplus._M_p,(char *)v,(int *)v_00);
      std::__cxx11::string::append((string *)s);
      goto LAB_00417bd9;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1a8,*v);
    std::__cxx11::stringbuf::str();
    local_1e0 = local_200[0];
    formatOne<char_const*>(&local_1d8,(detail *)nextFmt._M_dataplus._M_p,(char *)&local_1e0,v_00);
    std::__cxx11::string::append((string *)s);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  else {
    uVar4 = std::__cxx11::string::find((char)&nextFmt,100);
    v_01 = (int *)0x4978ed;
    std::__cxx11::string::replace((ulong)&nextFmt,uVar4,(char *)0x1);
    formatOne<int_const&>
              ((enable_if_t<_std::is_class<typename_std::decay_t<const_int_&>_>::value,_std::string>
                *)&ss,(detail *)nextFmt._M_dataplus._M_p,(char *)v,v_01);
    std::__cxx11::string::append((string *)s);
LAB_00417bd9:
    std::__cxx11::string::~string((string *)&ss);
  }
  stringPrintfRecursive<float_const&,pbrt::LightSamplerHandle_const&,bool_const&>
            (s,fmt_local,args,args_1,args_2);
LAB_00417c95:
  std::__cxx11::string::~string((string *)&nextFmt);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}